

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void common_set_adapter_lora
               (llama_context *ctx,
               vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *lora)

{
  long lVar1;
  common_adapter_lora_info *la;
  long lVar2;
  
  llama_clear_adapter_lora();
  lVar1 = *(long *)(lora + 8);
  for (lVar2 = *(long *)lora; lVar2 != lVar1; lVar2 = lVar2 + 0x30) {
    if ((*(float *)(lVar2 + 0x20) != 0.0) || (NAN(*(float *)(lVar2 + 0x20)))) {
      llama_set_adapter_lora(ctx,*(undefined8 *)(lVar2 + 0x28));
    }
  }
  return;
}

Assistant:

void common_set_adapter_lora(struct llama_context * ctx, std::vector<common_adapter_lora_info> & lora) {
    llama_clear_adapter_lora(ctx);
    for (auto & la : lora) {
        if (la.scale != 0.0f) {
            llama_set_adapter_lora(ctx, la.ptr, la.scale);
        }
    }
}